

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v5_16.c
# Opt level: O0

int can_update_sample_point_v5_16
              (can_bittiming_const *btc,uint sample_point_nominal,uint tseg,uint *tseg1_ptr,
              uint *tseg2_ptr,uint *sample_point_error_ptr)

{
  uint uVar1;
  uint local_74;
  uint local_70;
  uint local_6c;
  int __x;
  __u32 _min2;
  __u32 _max2;
  uint _max1;
  uint _min1;
  int i;
  uint tseg2;
  uint tseg1;
  uint best_sample_point;
  uint sample_point;
  uint best_sample_point_error;
  uint sample_point_error;
  uint *sample_point_error_ptr_local;
  uint *tseg2_ptr_local;
  uint *tseg1_ptr_local;
  uint tseg_local;
  uint sample_point_nominal_local;
  can_bittiming_const *btc_local;
  
  best_sample_point_error = 0xffffffff;
  best_sample_point = 0;
  for (i = 0; i < 2; i = i + 1) {
    uVar1 = ((tseg + 1) - (sample_point_nominal * (tseg + 1)) / 1000) - i;
    local_6c = btc->tseg2_min;
    if (local_6c < uVar1) {
      local_6c = uVar1;
    }
    local_70 = btc->tseg2_max;
    if (local_6c < local_70) {
      local_70 = local_6c;
    }
    tseg2 = local_70;
    tseg1 = tseg - local_70;
    if (btc->tseg1_max < tseg1) {
      tseg1 = btc->tseg1_max;
      tseg2 = tseg - tseg1;
    }
    uVar1 = (((tseg + 1) - tseg2) * 1000) / (tseg + 1);
    local_74 = sample_point_nominal - uVar1;
    if ((int)local_74 < 0) {
      local_74 = -local_74;
    }
    if ((uVar1 <= sample_point_nominal) && (local_74 < best_sample_point_error)) {
      best_sample_point_error = local_74;
      *tseg1_ptr = tseg1;
      *tseg2_ptr = tseg2;
      best_sample_point = uVar1;
    }
  }
  if (sample_point_error_ptr != (uint *)0x0) {
    *sample_point_error_ptr = best_sample_point_error;
  }
  return best_sample_point;
}

Assistant:

static int
can_update_sample_point(const struct can_bittiming_const *btc,
			unsigned int sample_point_nominal, unsigned int tseg,
			unsigned int *tseg1_ptr, unsigned int *tseg2_ptr,
			unsigned int *sample_point_error_ptr)
{
	unsigned int sample_point_error, best_sample_point_error = UINT_MAX;
	unsigned int sample_point, best_sample_point = 0;
	unsigned int tseg1, tseg2;
	int i;

	for (i = 0; i <= 1; i++) {
		tseg2 = tseg + CAN_SYNC_SEG -
			(sample_point_nominal * (tseg + CAN_SYNC_SEG)) /
			1000 - i;
		tseg2 = clamp(tseg2, btc->tseg2_min, btc->tseg2_max);
		tseg1 = tseg - tseg2;
		if (tseg1 > btc->tseg1_max) {
			tseg1 = btc->tseg1_max;
			tseg2 = tseg - tseg1;
		}

		sample_point = 1000 * (tseg + CAN_SYNC_SEG - tseg2) /
			(tseg + CAN_SYNC_SEG);
		sample_point_error = abs(sample_point_nominal - sample_point);

		if (sample_point <= sample_point_nominal &&
		    sample_point_error < best_sample_point_error) {
			best_sample_point = sample_point;
			best_sample_point_error = sample_point_error;
			*tseg1_ptr = tseg1;
			*tseg2_ptr = tseg2;
		}
	}

	if (sample_point_error_ptr)
		*sample_point_error_ptr = best_sample_point_error;

	return best_sample_point;
}